

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O0

void __thiscall
TTD::SnapshotExtractor::ExtractScopeIfNeeded
          (SnapshotExtractor *this,ScriptContext *ctx,FrameDisplay *environment)

{
  bool bVar1;
  uint16 uVar2;
  ScopeType SVar3;
  SlabAllocator *this_00;
  ScopeInfoEntry *pSVar4;
  void **ppvVar5;
  ScopeInfoEntry *local_48;
  ScopeInfoEntry *local_40;
  ScopeInfoEntry *entryInfo;
  void *scope;
  ScriptFunctionScopeInfo *pSStack_28;
  uint16 i;
  ScriptFunctionScopeInfo *funcScopeInfo;
  FrameDisplay *environment_local;
  ScriptContext *ctx_local;
  SnapshotExtractor *this_local;
  
  funcScopeInfo = (ScriptFunctionScopeInfo *)environment;
  environment_local = (FrameDisplay *)ctx;
  ctx_local = (ScriptContext *)this;
  bVar1 = MarkTable::IsMarked(&this->m_marks,environment);
  if (bVar1) {
    uVar2 = Js::FrameDisplay::GetLength((FrameDisplay *)funcScopeInfo);
    if (uVar2 == 0) {
      TTDAbort_unrecoverable_error("This doesn\'t make sense");
    }
    pSStack_28 = SnapShot::GetNextAvailableFunctionScopeEntry(this->m_pendingSnap);
    pSStack_28->ScopeId = (TTD_PTR_ID)funcScopeInfo;
    pSStack_28->ScriptContextLogId = (TTD_LOG_PTR_ID)environment_local[0x284];
    uVar2 = Js::FrameDisplay::GetLength((FrameDisplay *)funcScopeInfo);
    pSStack_28->ScopeCount = uVar2;
    this_00 = SnapShot::GetSnapshotSlabAllocator(this->m_pendingSnap);
    pSVar4 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapValues::ScopeInfoEntry>
                       (this_00,(ulong)pSStack_28->ScopeCount);
    pSStack_28->ScopeArray = pSVar4;
    for (scope._6_2_ = 0; scope._6_2_ < pSStack_28->ScopeCount; scope._6_2_ = scope._6_2_ + 1) {
      entryInfo = (ScopeInfoEntry *)
                  Js::FrameDisplay::GetItem((FrameDisplay *)funcScopeInfo,(uint)scope._6_2_);
      local_40 = pSStack_28->ScopeArray + scope._6_2_;
      SVar3 = Js::FrameDisplay::GetScopeType(entryInfo);
      local_40->Tag = SVar3;
      SVar3 = local_40->Tag;
      if (SVar3 == ScopeType_ActivationObject) {
LAB_00d32fc3:
        local_48 = entryInfo;
        ppvVar5 = Memory::PointerValue<void>(&local_48);
        local_40->IDValue = (TTD_PTR_ID)*ppvVar5;
      }
      else {
        if (SVar3 != ScopeType_SlotArray) {
          if (SVar3 != ScopeType_WithScope) {
            TTDAbort_unrecoverable_error("Unknown scope kind");
          }
          goto LAB_00d32fc3;
        }
        ExtractSlotArrayIfNeeded(this,(ScriptContext *)environment_local,(Type *)entryInfo);
        local_40->IDValue = (TTD_PTR_ID)entryInfo;
      }
    }
    MarkTable::ClearMark(&this->m_marks,funcScopeInfo);
  }
  return;
}

Assistant:

void SnapshotExtractor::ExtractScopeIfNeeded(Js::ScriptContext* ctx, Js::FrameDisplay* environment)
    {
        if(this->m_marks.IsMarked(environment))
        {
            TTDAssert(environment->GetLength() > 0, "This doesn't make sense");

            NSSnapValues::ScriptFunctionScopeInfo* funcScopeInfo = this->m_pendingSnap->GetNextAvailableFunctionScopeEntry();
            funcScopeInfo->ScopeId = TTD_CONVERT_ENV_TO_PTR_ID(environment);
            funcScopeInfo->ScriptContextLogId = ctx->ScriptContextLogTag;

            funcScopeInfo->ScopeCount = environment->GetLength();
            funcScopeInfo->ScopeArray = this->m_pendingSnap->GetSnapshotSlabAllocator().SlabAllocateArray<NSSnapValues::ScopeInfoEntry>(funcScopeInfo->ScopeCount);

            for(uint16 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                void* scope = environment->GetItem(i);
                NSSnapValues::ScopeInfoEntry* entryInfo = (funcScopeInfo->ScopeArray + i);

                entryInfo->Tag = environment->GetScopeType(scope);
                switch(entryInfo->Tag)
                {
                case Js::ScopeType::ScopeType_ActivationObject:
                case Js::ScopeType::ScopeType_WithScope:
                    entryInfo->IDValue = TTD_CONVERT_VAR_TO_PTR_ID((Js::Var)scope);
                    break;
                case Js::ScopeType::ScopeType_SlotArray:
                {
                    this->ExtractSlotArrayIfNeeded(ctx, (Field(Js::Var)*)scope);

                    entryInfo->IDValue = TTD_CONVERT_SLOTARRAY_TO_PTR_ID((Js::Var*)scope);
                    break;
                }
                default:
                    TTDAssert(false, "Unknown scope kind");
                    entryInfo->IDValue = TTD_INVALID_PTR_ID;
                    break;
                }
            }

            this->m_marks.ClearMark(environment);
        }
    }